

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::getIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom,
          RunOn param_6,Box *param_7)

{
  void *in_RCX;
  Array4<double> *in_RDI;
  CoordSys *in_R8;
  Box bx;
  Array4<const_unsigned_int> *type;
  Array4<double> *inter;
  int idim;
  XDim3 *tri_norm;
  Triangle *tri_pts;
  GpuArray<double,_3U> dx;
  GpuArray<double,_3U> plo;
  int num_triangles;
  Box *in_stack_fffffffffffffe50;
  Geometry *in_stack_fffffffffffffe60;
  anon_class_264_9_be4bf7a1 *f;
  Box *box;
  undefined1 auStack_128 [64];
  undefined1 auStack_e8 [96];
  const_reference local_88;
  const_reference local_80;
  int local_74;
  XDim3 *local_70;
  Triangle *local_68;
  GpuArray<double,_3U> local_60;
  anon_class_264_9_be4bf7a1 *local_40;
  Box *local_38;
  undefined4 local_30;
  CoordSys *local_28;
  void *local_20;
  
  local_30 = (undefined4)in_RDI[1].jstride;
  local_28 = in_R8;
  local_20 = in_RCX;
  Geometry::ProbLoArray(in_stack_fffffffffffffe60);
  CoordSys::CellSizeArray(&local_60,local_28);
  local_68 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::data
                       ((PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
                         *)&in_RDI->nstride);
  local_70 = PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::data
                       ((PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *)&(in_RDI->end).y);
  for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
    local_80 = std::array<amrex::Array4<double>,_3UL>::operator[]
                         ((array<amrex::Array4<double>,_3UL> *)in_stack_fffffffffffffe50,
                          (size_type)in_RDI);
    local_88 = std::array<amrex::Array4<const_unsigned_int>,_3UL>::operator[]
                         ((array<amrex::Array4<const_unsigned_int>,_3UL> *)in_stack_fffffffffffffe50
                          ,(size_type)in_RDI);
    Box::Box<double>(in_stack_fffffffffffffe50,in_RDI);
    memcpy(&stack0xfffffffffffffe50,local_88,0x3c);
    f = local_40;
    box = local_38;
    memcpy(auStack_128,local_20,0x3c);
    memcpy(auStack_e8,local_80,0x3c);
    ParallelFor<amrex::STLtools::getIntercept(std::array<amrex::Array4<double>,3ul>const&,std::array<amrex::Array4<unsigned_int_const>,3ul>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::RunOn,amrex::Box_const&)const::__0>
              (box,f);
  }
  return;
}

Assistant:

void
STLtools::getIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                        Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                        Array4<Real const> const& lst ,Geometry const& geom,
                        RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    const XDim3* tri_norm = m_tri_normals_d.data();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real r = std::numeric_limits<Real>::quiet_NaN();
            if (type(i,j,k) == EB2::Type::irregular) {
                XDim3 p1{plo[0]+i*dx[0],
                         plo[1]+j*dx[1],
#if (AMREX_SPACEDIM == 2)
                         Real(0.)
#else
                         plo[2]+k*dx[2]
#endif
                };
                if (idim == 0) {
                    Real x2 = plo[0]+(i+1)*dx[0];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto tmp = edge_tri_intersects(p1.x, x2, p1.y, p1.z,
                                                       tri.v1, tri.v2, tri.v3,
                                                       tri_norm[it],
                                                       lst(i+1,j,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.x : x2;
                    }
                } else if (idim == 1) {
                    Real y2 = plo[1]+(j+1)*dx[1];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.y, y2, p1.z, p1.x,
                                                       {tri.v1.y, tri.v1.z, tri.v1.x},
                                                       {tri.v2.y, tri.v2.z, tri.v2.x},
                                                       {tri.v3.y, tri.v3.z, tri.v3.x},
                                                       {  norm.y,   norm.z,   norm.x},
                                                       lst(i,j+1,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.y : y2;
                    }
                } else {
                    Real z2 = plo[2]+(k+1)*dx[2];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.z, z2, p1.x, p1.y,
                                                       {tri.v1.z, tri.v1.x, tri.v1.y},
                                                       {tri.v2.z, tri.v2.x, tri.v2.y},
                                                       {tri.v3.z, tri.v3.x, tri.v3.y},
                                                       {  norm.z,   norm.x,   norm.y},
                                                       lst(i,j,k+1)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.z : z2;
                    }
                }
            }
            inter(i,j,k) = r;
        });
    }
}